

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractWrittenFont::WriteGlyphEncodingInfoState
          (AbstractWrittenFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID,
          GlyphEncodingInfo *inGlyphEncodingInfo)

{
  ObjectIDType this_00;
  bool bVar1;
  Trace *this_01;
  DictionaryContext *pDVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_100;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f8;
  const_iterator it;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  DictionaryContext *local_40;
  DictionaryContext *glyphEncodingInfoObject;
  GlyphEncodingInfo *pGStack_30;
  EStatusCode status;
  GlyphEncodingInfo *inGlyphEncodingInfo_local;
  ObjectIDType inObjectID_local;
  ObjectsContext *inStateWriter_local;
  AbstractWrittenFont *this_local;
  
  pGStack_30 = inGlyphEncodingInfo;
  inGlyphEncodingInfo_local = (GlyphEncodingInfo *)inObjectID;
  inObjectID_local = (ObjectIDType)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  glyphEncodingInfoObject._4_4_ = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (glyphEncodingInfoObject._4_4_ == eSuccess) {
    pDVar2 = ObjectsContext::StartDictionary((ObjectsContext *)inObjectID_local);
    local_40 = pDVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Type",&local_61);
    DictionaryContext::WriteKey(pDVar2,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pDVar2 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"GlyphEncodingInfo",&local_99);
    DictionaryContext::WriteNameValue(pDVar2,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pDVar2 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"mEncodedCharacter",&local_c1);
    DictionaryContext::WriteKey(pDVar2,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    DictionaryContext::WriteIntegerValue(local_40,(ulong)pGStack_30->mEncodedCharacter);
    pDVar2 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"mUnicodeCharacters",
               (allocator<char> *)((long)&it._M_current + 7));
    DictionaryContext::WriteKey(pDVar2,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    ObjectsContext::StartArray((ObjectsContext *)inObjectID_local);
    local_f8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (&pGStack_30->mUnicodeCharacters);
    while( true ) {
      local_100._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     (&pGStack_30->mUnicodeCharacters);
      bVar1 = __gnu_cxx::operator!=(&local_f8,&local_100);
      this_00 = inObjectID_local;
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_f8);
      ObjectsContext::WriteInteger((ObjectsContext *)this_00,*puVar3,eTokenSeparatorSpace);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_f8);
    }
    ObjectsContext::EndArray((ObjectsContext *)inObjectID_local,eTokenSeparatorEndLine);
    ObjectsContext::EndDictionary((ObjectsContext *)inObjectID_local,local_40);
    ObjectsContext::EndIndirectObject((ObjectsContext *)inObjectID_local);
    this_local._4_4_ = glyphEncodingInfoObject._4_4_;
  }
  else {
    this_01 = Trace::DefaultTrace();
    Trace::TraceToLog(this_01,
                      "AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld"
                      ,inGlyphEncodingInfo_local);
    this_local._4_4_ = glyphEncodingInfoObject._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode AbstractWrittenFont::WriteGlyphEncodingInfoState(ObjectsContext* inStateWriter,
													  ObjectIDType inObjectID,
													  const GlyphEncodingInfo& inGlyphEncodingInfo)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);	
	if(status != PDFHummus::eSuccess) {
		TRACE_LOG1("AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld",inObjectID);
		return status;
	}
	DictionaryContext* glyphEncodingInfoObject = inStateWriter->StartDictionary();

	glyphEncodingInfoObject->WriteKey("Type");
	glyphEncodingInfoObject->WriteNameValue("GlyphEncodingInfo");

	glyphEncodingInfoObject->WriteKey("mEncodedCharacter");
	glyphEncodingInfoObject->WriteIntegerValue(inGlyphEncodingInfo.mEncodedCharacter);

	glyphEncodingInfoObject->WriteKey("mUnicodeCharacters");
	inStateWriter->StartArray();
	
	ULongVector::const_iterator it = inGlyphEncodingInfo.mUnicodeCharacters.begin();
	for(; it != inGlyphEncodingInfo.mUnicodeCharacters.end();++it)
		inStateWriter->WriteInteger(*it);

	inStateWriter->EndArray(eTokenSeparatorEndLine);

	inStateWriter->EndDictionary(glyphEncodingInfoObject);
	inStateWriter->EndIndirectObject();

	return status;
	
}